

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O1

char * __thiscall CEExceptionHandler::what(CEExceptionHandler *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::clear();
  std::operator+(&local_110,"[ERROR] ",&this->type_);
  std::operator+(&local_f0,&local_110,": ");
  std::operator+(&local_d0,&local_f0,&this->origin_);
  std::operator+(&local_b0,&local_d0,"\n");
  std::operator+(&local_90,&local_b0,&this->message_);
  std::operator+(&local_70,&local_90,"\n");
  std::operator+(&local_50,&local_70,&this->backtrace_);
  std::operator+(&local_30,&local_50,"\n");
  std::__cxx11::string::operator+=((string *)&this->full_msg_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

const char* CEExceptionHandler::what() const noexcept
{
    // Define the header of the error message
    full_msg_.clear();
    full_msg_ += "[ERROR] " + type_ + ": " + origin_ + "\n" + 
                      message_ + "\n" + backtrace_ + "\n";

    return full_msg_.c_str();
}